

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.c
# Opt level: O0

void cstr_fill_bytes(char **cstring,char byte,size_t len)

{
  STRING_HEADER *header;
  size_t len_local;
  char byte_local;
  char **cstring_local;
  
  cstr_resize(cstring,len);
  memset(*cstring,(uint)(byte)byte,len);
  *(size_t *)(*cstring + -0x10) = len;
  return;
}

Assistant:

static void
cstr_fill_bytes(char** cstring, char byte, size_t len)
{
  struct STRING_HEADER* header;

  /* resize the string with the given length */
  cstr_resize(cstring, len);
  /* initialize the memory of the cstring with byte */
  memset((void*)*cstring, (int)byte, len);
  /* dereference here since the memory address might have changed in cstr_resize */
  header = GET_HEADER(*cstring);
  /* set the length of the string to the newly allocated length */
  header->strlen = len;
}